

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void av1_set_offsets(AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,
                    BLOCK_SIZE bsize)

{
  byte bVar1;
  MACROBLOCK *x_00;
  char *pcVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  uint8_t *map;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  segmentation *seg;
  AV1_COMMON *cm;
  uint8_t *local_58;
  undefined7 in_stack_ffffffffffffffd8;
  
  x_00 = (MACROBLOCK *)(in_RDI + 0x3bf80);
  pcVar2 = (char *)(in_RDI + 0x409b8);
  lVar3 = in_RDX + 0x1a0;
  av1_set_offsets_without_segment_id
            ((AV1_COMP *)CONCAT44(in_ECX,in_R8D),
             (TileInfo *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),x_00,
             (int)((ulong)pcVar2 >> 0x20),(int)pcVar2,(BLOCK_SIZE)((ulong)lVar3 >> 0x38));
  lVar3 = **(long **)(lVar3 + 0x1eb8);
  *(ushort *)(lVar3 + 0xa7) = *(ushort *)(lVar3 + 0xa7) & 0xfff8;
  if (*pcVar2 != '\0') {
    if ((*pcVar2 != '\0') && (*(int *)(in_RDI + 0x81330) == 0)) {
      if (pcVar2[1] == '\0') {
        local_58 = *(uint8_t **)((x_00->mode_costs).y_mode_costs[1][10] + 7);
      }
      else {
        local_58 = *(uint8_t **)(in_RDI + 0x71298);
      }
      if (local_58 == (uint8_t *)0x0) {
        bVar1 = 0;
      }
      else {
        bVar1 = get_segment_id((CommonModeInfoParams *)&(x_00->e_mbd).plane[0].pre[1].buf0,local_58,
                               in_R9B,in_ECX,in_R8D);
      }
      *(ushort *)(lVar3 + 0xa7) = *(ushort *)(lVar3 + 0xa7) & 0xfff8 | bVar1 & 7;
    }
    av1_init_plane_quantizers(cpi,(MACROBLOCK *)tile,x._4_4_,(int)x);
  }
  return;
}

Assistant:

void av1_set_offsets(const AV1_COMP *const cpi, const TileInfo *const tile,
                     MACROBLOCK *const x, int mi_row, int mi_col,
                     BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);

  // Setup segment ID.
  mbmi = xd->mi[0];
  mbmi->segment_id = 0;
  if (seg->enabled) {
    if (seg->enabled && !cpi->vaq_refresh) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mbmi->segment_id =
          map ? get_segment_id(&cm->mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    av1_init_plane_quantizers(cpi, x, mbmi->segment_id, 0);
  }
#ifndef NDEBUG
  x->last_set_offsets_loc.mi_row = mi_row;
  x->last_set_offsets_loc.mi_col = mi_col;
  x->last_set_offsets_loc.bsize = bsize;
#endif  // NDEBUG
}